

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<std::complex<float>_> * __thiscall
webrtc::Matrix<std::complex<float>_>::Add
          (Matrix<std::complex<float>_> *this,Matrix<std::complex<float>_> *operand)

{
  size_type sVar1;
  const_reference __z;
  reference this_00;
  ulong local_320;
  size_t i;
  string *local_1a0;
  string *_result_1;
  string *local_20;
  string *_result;
  Matrix<std::complex<float>_> *operand_local;
  Matrix<std::complex<float>_> *this_local;
  
  _result = (string *)operand;
  operand_local = this;
  local_20 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&this->num_rows_,&operand->num_rows_,"num_rows_ == operand.num_rows_");
  if (local_20 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/matrix.h"
               ,0xa2,local_20);
    rtc::FatalMessage::stream((FatalMessage *)&_result_1);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_1);
  }
  local_1a0 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                        (&this->num_columns_,(unsigned_long *)(_result + 0x10),
                         "num_columns_ == operand.num_columns_");
  if (local_1a0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&i,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/matrix.h"
               ,0xa3,local_1a0);
    rtc::FatalMessage::stream((FatalMessage *)&i);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&i);
  }
  local_320 = 0;
  local_1a0 = (string *)0x0;
  while( true ) {
    sVar1 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::size
                      (&this->data_);
    if (sVar1 <= local_320) break;
    __z = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator[]
                    ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                     (_result + 0x18),local_320);
    this_00 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator[]
                        (&this->data_,local_320);
    std::complex<float>::operator+=(this_00,__z);
    local_320 = local_320 + 1;
  }
  return this;
}

Assistant:

Matrix& Add(const Matrix& operand) {
    RTC_CHECK_EQ(num_rows_, operand.num_rows_);
    RTC_CHECK_EQ(num_columns_, operand.num_columns_);

    for (size_t i = 0; i < data_.size(); ++i) {
      data_[i] += operand.data_[i];
    }

    return *this;
  }